

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void __thiscall polyscope::Histogram::Histogram(Histogram *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  
  (this->colormapRange).first = 0.0;
  (this->colormapRange).second = 0.0;
  auVar2 = ZEXT464(0) << 0x40;
  this->rawHistBinCount = 0x33;
  this->rawHistCurveY = (vector<float,_std::allocator<float>_>)auVar2._0_24_;
  this->rawHistCurveX =
       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>)auVar2._24_24_;
  (this->dataRange).first = (double)SUB168(auVar2._48_16_,0);
  (this->dataRange).second = (double)SUB168(auVar2._48_16_,8);
  this->texDim = 600;
  auVar1 = ZEXT432(0) << 0x20;
  this->texture = (shared_ptr<polyscope::render::TextureBuffer>)auVar1._0_16_;
  this->framebuffer = (shared_ptr<polyscope::render::FrameBuffer>)auVar1._16_16_;
  this->framebuffer = (shared_ptr<polyscope::render::FrameBuffer>)auVar1._0_16_;
  this->program = (shared_ptr<polyscope::render::ShaderProgram>)auVar1._16_16_;
  (this->colormap)._M_dataplus._M_p = (pointer)&(this->colormap).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->colormap,"viridis","");
  this->bottomBarHeight = 0.35;
  this->bottomBarGap = 0.1;
  return;
}

Assistant:

Histogram::Histogram() {}